

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O3

void __thiscall
BVFixed::SetRange<Js::LoopFlags>(BVFixed *this,LoopFlags *value,BVIndex start,BVIndex len)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  sbyte sVar4;
  LoopFlags *pLVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  BVIndex i;
  uint uVar11;
  ulong local_38;
  BVUnitTContainer temp;
  
  AssertRange(this,start);
  if (len != 0) {
    if (8 < len) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xf2,"(len <= sizeof(Container) * MachBits)",
                         "len <= sizeof(Container) * MachBits");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    i = (len + start) - 1;
    AssertRange(this,i);
    uVar9 = start >> 6;
    uVar6 = (ulong)uVar9;
    uVar10 = i >> 6;
    uVar11 = i & 0x3f;
    local_38 = (ulong)(byte)*value;
    sVar4 = (sbyte)(start & 0x3f);
    if (uVar10 == uVar9) {
      uVar6 = ~(-1L << ((char)(uVar11 + 1) - sVar4 & 0x3fU));
      if (uVar11 + 1 == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
      this[(ulong)uVar9 + 1] =
           (BVFixed)((~(uVar6 << sVar4) | local_38 << sVar4) &
                    ((local_38 & uVar6) << sVar4 | (ulong)this[(ulong)uVar9 + 1]));
      pLVar5 = (LoopFlags *)&local_38;
    }
    else if ((start & 0x3f) == 0) {
      if (uVar9 < uVar10) {
        memcpy((void *)((long)&this[1].len + (ulong)(start >> 3)),&local_38,
               (ulong)(~uVar9 + uVar10) * 8 + 8);
        pLVar5 = (LoopFlags *)(&temp + (~uVar9 + uVar10));
        local_38 = *(ulong *)pLVar5;
      }
      else {
        pLVar5 = (LoopFlags *)&local_38;
      }
      uVar6 = ~(-1L << ((byte)(uVar11 + 1) & 0x3f));
      if (uVar11 + 1 == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
      this[(ulong)uVar10 + 1] =
           (BVFixed)((~uVar6 | local_38) & (local_38 & uVar6 | (ulong)this[(ulong)uVar10 + 1]));
    }
    else {
      this[(ulong)uVar9 + 1] =
           (BVFixed)(~(-1L << sVar4) & (ulong)this[(ulong)uVar9 + 1] | local_38 << sVar4);
      if (uVar9 + 1 < uVar10) {
        puVar7 = &local_38;
        do {
          uVar8 = local_38 >> (0x40U - sVar4 & 0x3f);
          local_38 = puVar7[1];
          puVar7 = puVar7 + 1;
          this[uVar6 + 2] = (BVFixed)(local_38 << sVar4 | uVar8);
          uVar6 = uVar6 + 1;
        } while ((ulong)uVar10 - 1 != uVar6);
      }
      else {
        puVar7 = &local_38;
      }
      pLVar5 = (LoopFlags *)(puVar7 + 1);
      uVar8 = puVar7[1] << sVar4 | local_38 >> (0x40U - sVar4 & 0x3f);
      uVar6 = ~(-1L << ((byte)(uVar11 + 1) & 0x3f));
      if (uVar11 + 1 == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
      this[(ulong)uVar10 + 1] =
           (BVFixed)((~uVar6 | uVar8) & (uVar8 & uVar6 | (ulong)this[(ulong)uVar10 + 1]));
    }
    *value = *pLVar5;
  }
  return;
}

Assistant:

void BVFixed::SetRange(Container* value, BVIndex start, BVIndex len)
{
    AssertRange(start);
    if (len == 0)
    {
        return;
    }
    Assert(len <= sizeof(Container) * MachBits);
    BVIndex end = start + len - 1;
    AssertRange(end);
    BVIndex iStart = BVUnit::Position(start);
    BVIndex iEnd = BVUnit::Position(end);
    BVIndex oStart = BVUnit::Offset(start);
    BVIndex oEnd = BVUnit::Offset(end);

    BVUnit::BVUnitTContainer temp;
    BVUnit::BVUnitTContainer* bits;
    static_assert(sizeof(Container) == 1 || sizeof(Container) == sizeof(BVUnit::BVUnitTContainer),
        "Container is not suitable to represent the calculated value");
    if (sizeof(Container) == 1)
    {
        static_assert(sizeof(byte) == 1, "Size of byte should be 1.");
        temp = *(byte*)value;
        bits = &temp;
    }
    else
    {
        bits = (BVUnit::BVUnitTContainer*)value;
    }
    const int oStartComplement = BVUnit::BitsPerWord - oStart;
    static_assert((BVUnit::BVUnitTContainer)BVUnit::AllOnesMask > 0, "Container type of BVFixed must be unsigned");
    //When making the mask, check the special case when we need all bits
#define MAKE_MASK(start, end) ( ((end) == BVUnit::BitsPerWord ? BVUnit::AllOnesMask : (((BVUnit::BVUnitTContainer)1 << ((end) - (start))) - 1))   << (start))
    // Or the value to set the bits to 1. And the value to set the bits to 0
    // The mask is used to make sure we don't modify the bits outside the range
#define SET_RANGE(i, value, mask) \
    this->data[i].Or((value) & mask);\
    this->data[i].And((value) | ~mask);

    BVUnit::BVUnitTContainer bitsToSet;
    // Fast Path
    if (iEnd == iStart)
    {
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, oEnd + 1);
        // Shift to position the bits
        bitsToSet = (*bits << oStart);
        SET_RANGE(iStart, bitsToSet, mask);
    }
    // TODO: case iEnd == iStart + 1 to avoid a loop
    else if (oStart == 0)
    {
        // Simpler case where we don't have to shift the bits around
        for (uint i = iStart; i < iEnd; ++i)
        {
            SET_RANGE(i, *bits, BVUnit::AllOnesMask);
            ++bits;
        }
        // We still need to use a mask to remove the unused bits
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
        SET_RANGE(iEnd, *bits, mask);
    }
    else
    {
        // Default case. We need to process everything 1 at a time
        {
            // First set the first bits
CLANG_WNO_BEGIN("-Wtautological-compare")
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, BVUnit::BitsPerWord);
CLANG_WNO_END
            SET_RANGE(iStart, *bits << oStart, mask);
        }
        // Set the bits in the middle
        for (uint i = iStart + 1; i < iEnd; ++i)
        {
            bitsToSet = *bits >> oStartComplement;
            ++bits;
            bitsToSet |= *bits << oStart;
            SET_RANGE(i, bitsToSet, BVUnit::AllOnesMask);
        }
        // Set the last bits
        bitsToSet = *bits >> oStartComplement;
        ++bits;
        bitsToSet |= *bits << oStart;
        {
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
            SET_RANGE(iEnd, bitsToSet, mask);
        }
    }

    if (sizeof(Container) == 1)
    {
        // Calculation above might overflow the original container.
        // normalize the overflow value. LE only
        temp = (*((char*)bits)) + (*(((char*)bits) + 1));
        memcpy(value, bits, 1);
    }
#undef MAKE_MASK
#undef SET_RANGE
}